

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

bool __thiscall CMU462::StaticScene::BVHAccel::intersect(BVHAccel *this,Ray *ray,Intersection *i)

{
  pointer ppPVar1;
  Primitive *pPVar2;
  int iVar3;
  byte bVar4;
  size_t p;
  ulong uVar5;
  
  bVar4 = 0;
  uVar5 = 0;
  while( true ) {
    ppPVar1 = (this->super_Aggregate).primitives.
              super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_Aggregate).primitives.
                      super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <= uVar5)
    break;
    pPVar2 = ppPVar1[uVar5];
    iVar3 = (*pPVar2->_vptr_Primitive[2])(pPVar2,ray,i);
    bVar4 = bVar4 | (byte)iVar3;
    uVar5 = uVar5 + 1;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool BVHAccel::intersect(const Ray &ray, Intersection *i) const {

    // TODO:
    // Implement ray - bvh aggregate intersection test. A ray intersects
    // with a BVH aggregate if and only if it intersects a primitive in
    // the BVH that is not an aggregate. When an intersection does happen.
    // You should store the non-aggregate primitive in the intersection data
    // and not the BVH aggregate itself.

    bool hit = false;
    for (size_t p = 0; p < primitives.size(); ++p) {
      if(primitives[p]->intersect(ray, i)) hit = true;
    }

    return hit;

  }